

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_initgamedialog.h
# Opt level: O2

void __thiscall Ui_InitGameDialog::setupUi(Ui_InitGameDialog *this,QDialog *InitGameDialog)

{
  storage_type *psVar1;
  QGridLayout *this_00;
  QLabel *pQVar2;
  QLineEdit *pQVar3;
  QDialogButtonBox *this_01;
  QSpinBox *this_02;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  undefined8 in_stack_ffffffffffffff98;
  uint uVar14;
  ulong uVar13;
  QArrayDataPointer<char16_t> local_58;
  Object local_40 [8];
  Object local_38 [8];
  
  uVar14 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (local_58.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("InitGameDialog",0xf);
    QVar4.m_data = psVar1;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar4);
    QObject::setObjectName((QString *)InitGameDialog);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  QWidget::resize((QWidget *)InitGameDialog,400,300);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,(QWidget *)InitGameDialog);
  this->gridLayout = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout",0xb);
  QVar5.m_data = psVar1;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  pQVar2 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar2,InitGameDialog,0);
  this->player1Label = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("player1Label",0xd);
  QVar6.m_data = psVar1;
  QVar6.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  uVar13 = (ulong)uVar14 << 0x20;
  QGridLayout::addWidget(this->gridLayout,this->player1Label,0,1,1,1,uVar13);
  pQVar3 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar3,(QWidget *)InitGameDialog);
  this->editPlayer1 = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("editPlayer1",0xc);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  uVar13 = uVar13 & 0xffffffff00000000;
  QGridLayout::addWidget(this->gridLayout,this->editPlayer1,0,4,1,1,uVar13);
  pQVar2 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar2,InitGameDialog,0);
  this->player2Label = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("player2Label",0xd);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  uVar13 = uVar13 & 0xffffffff00000000;
  QGridLayout::addWidget(this->gridLayout,this->player2Label,1,1,1,1,uVar13);
  pQVar3 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar3,(QWidget *)InitGameDialog);
  this->editPlayer2 = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("editPlayer2",0xc);
  QVar9.m_data = psVar1;
  QVar9.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  uVar13 = uVar13 & 0xffffffff00000000;
  QGridLayout::addWidget(this->gridLayout,this->editPlayer2,1,4,1,1,uVar13);
  this_01 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(this_01,(QWidget *)InitGameDialog);
  this->buttonBox = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("buttonBox",10);
  QVar10.m_data = psVar1;
  QVar10.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDialogButtonBox::setOrientation((Orientation)this->buttonBox);
  QDialogButtonBox::setStandardButtons(this->buttonBox,0x400400);
  uVar13 = uVar13 & 0xffffffff00000000;
  QGridLayout::addWidget(this->gridLayout,this->buttonBox,3,1,1,4,uVar13);
  pQVar2 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar2,InitGameDialog,0);
  this->label = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("label",6);
  QVar11.m_data = psVar1;
  QVar11.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  uVar13 = uVar13 & 0xffffffff00000000;
  QGridLayout::addWidget(this->gridLayout,this->label,2,1,1,1,uVar13);
  this_02 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(this_02,(QWidget *)InitGameDialog);
  this->spinBox = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("spinBox",8);
  QVar12.m_data = psVar1;
  QVar12.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QSpinBox::setValue((int)this->spinBox);
  QGridLayout::addWidget(this->gridLayout,this->spinBox,2,4,1,1,uVar13 & 0xffffffff00000000);
  retranslateUi(this,InitGameDialog);
  local_58.d = (Data *)0x1b9;
  local_58.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_38,(offset_in_QDialogButtonBox_to_subr)this->buttonBox,
             (Object *)QDialogButtonBox::accepted,0,(ConnectionType)InitGameDialog);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_58.d = (Data *)0x1c1;
  local_58.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_40,(offset_in_QDialogButtonBox_to_subr)this->buttonBox,
             (Object *)QDialogButtonBox::rejected,0,(ConnectionType)InitGameDialog);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QMetaObject::connectSlotsByName((QObject *)InitGameDialog);
  return;
}

Assistant:

void setupUi(QDialog *InitGameDialog)
    {
        if (InitGameDialog->objectName().isEmpty())
            InitGameDialog->setObjectName(QString::fromUtf8("InitGameDialog"));
        InitGameDialog->resize(400, 300);
        gridLayout = new QGridLayout(InitGameDialog);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        player1Label = new QLabel(InitGameDialog);
        player1Label->setObjectName(QString::fromUtf8("player1Label"));

        gridLayout->addWidget(player1Label, 0, 1, 1, 1);

        editPlayer1 = new QLineEdit(InitGameDialog);
        editPlayer1->setObjectName(QString::fromUtf8("editPlayer1"));

        gridLayout->addWidget(editPlayer1, 0, 4, 1, 1);

        player2Label = new QLabel(InitGameDialog);
        player2Label->setObjectName(QString::fromUtf8("player2Label"));

        gridLayout->addWidget(player2Label, 1, 1, 1, 1);

        editPlayer2 = new QLineEdit(InitGameDialog);
        editPlayer2->setObjectName(QString::fromUtf8("editPlayer2"));

        gridLayout->addWidget(editPlayer2, 1, 4, 1, 1);

        buttonBox = new QDialogButtonBox(InitGameDialog);
        buttonBox->setObjectName(QString::fromUtf8("buttonBox"));
        buttonBox->setOrientation(Qt::Horizontal);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        gridLayout->addWidget(buttonBox, 3, 1, 1, 4);

        label = new QLabel(InitGameDialog);
        label->setObjectName(QString::fromUtf8("label"));

        gridLayout->addWidget(label, 2, 1, 1, 1);

        spinBox = new QSpinBox(InitGameDialog);
        spinBox->setObjectName(QString::fromUtf8("spinBox"));
        spinBox->setValue(3);

        gridLayout->addWidget(spinBox, 2, 4, 1, 1);


        retranslateUi(InitGameDialog);
        QObject::connect(buttonBox, &QDialogButtonBox::accepted, InitGameDialog, qOverload<>(&QDialog::accept));
        QObject::connect(buttonBox, &QDialogButtonBox::rejected, InitGameDialog, qOverload<>(&QDialog::reject));

        QMetaObject::connectSlotsByName(InitGameDialog);
    }